

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::enclose_expression(CompilerGLSL *this,string *expr)

{
  bool bVar1;
  string *in_RDX;
  char local_22 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *expr_local;
  CompilerGLSL *this_local;
  
  local_20 = in_RDX;
  expr_local = expr;
  this_local = this;
  bVar1 = needs_enclose_expression(in_RDX);
  if (bVar1) {
    local_22[1] = 0x28;
    local_22[0] = ')';
    join<char,std::__cxx11::string_const&,char>((spirv_cross *)this,local_22 + 1,local_20,local_22);
  }
  else {
    ::std::__cxx11::string::string((string *)this,(string *)local_20);
  }
  return this;
}

Assistant:

string CompilerGLSL::enclose_expression(const string &expr)
{
	// If this expression contains any spaces which are not enclosed by parentheses,
	// we need to enclose it so we can treat the whole string as an expression.
	// This happens when two expressions have been part of a binary op earlier.
	if (needs_enclose_expression(expr))
		return join('(', expr, ')');
	else
		return expr;
}